

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void clear_advisor_read_lock(char *filename)

{
  uint __errnum;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  
  do {
    iVar1 = unlink(filename);
    if (iVar1 == 0) {
      return;
    }
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
  } while (__errnum == 4);
  pcVar3 = strerror(__errnum);
  logmsg("Error removing lock file %s error: %d %s",filename,(ulong)__errnum,pcVar3);
  return;
}

Assistant:

void clear_advisor_read_lock(const char *filename)
{
  int error = 0;
  int res;

  /*
  ** Log all removal failures. Even those due to file not existing.
  ** This allows to detect if unexpectedly the file has already been
  ** removed by a process different than the one that should do this.
  */

  do {
    res = unlink(filename);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error removing lock file %s error: %d %s",
           filename, error, strerror(error));
}